

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O0

uint32_t MAFSA_delta(uint32_t *links,uint32_t state,MAFSA_letter label)

{
  MAFSA_letter MVar1;
  int iVar2;
  uint32_t uVar3;
  MAFSA_letter in_DL;
  uint32_t in_ESI;
  long in_RDI;
  uint32_t t;
  uint32_t links_begin;
  uint32_t local_20;
  uint32_t local_1c;
  
  local_1c = node_get_children_start(in_ESI);
  local_20 = *(uint32_t *)(in_RDI + (ulong)local_1c * 4);
  while( true ) {
    iVar2 = link_is_terminating(local_20);
    if (iVar2 != 0) {
      return 0;
    }
    MVar1 = link_get_label(local_20);
    if (MVar1 == in_DL) break;
    local_1c = local_1c + 1;
    local_20 = *(uint32_t *)(in_RDI + (ulong)local_1c * 4);
  }
  uVar3 = link_get_link(local_20);
  return uVar3;
}

Assistant:

static uint32_t MAFSA_delta(const uint32_t * links, uint32_t state, MAFSA_letter label)
{
    uint32_t links_begin = node_get_children_start(state);
    uint32_t t = links[links_begin];

    while (!link_is_terminating(t))
    {
        if (link_get_label(t) == label)
        {
            return link_get_link(t);
        }

        t = links[++links_begin];
    }

    return 0;
}